

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_head.c
# Opt level: O1

ufile_error ufile_head(char *bucket_name,char *key,ufile_file_info *info)

{
  uint uVar1;
  CURL *curl;
  char *pcVar2;
  ufile_error uVar3;
  http_options opt;
  http_options hStack_48;
  
  uVar3 = check_bucket_key(bucket_name,key);
  pcVar2 = uVar3.message;
  uVar1 = uVar3.code;
  if (uVar1 == 0 || uVar1 - 200 < 100) {
    curl = (CURL *)curl_easy_init();
    if (curl == (CURL *)0x0) {
      pcVar2 = "init curl failed.";
      uVar1 = 0xffffffec;
    }
    else {
      uVar3 = set_http_options(&hStack_48,"HEAD","",bucket_name,key,(char *)0x0);
      pcVar2 = uVar3.message;
      uVar1 = uVar3.code;
      if (uVar1 == 0 || uVar1 - 200 < 100) {
        set_curl_options(curl,&hStack_48);
        curl_easy_setopt(curl,0x4e6f,head_header_cb);
        curl_easy_setopt(curl,0x272d,info);
        curl_easy_setopt(curl,0x2c,1);
        uVar3 = curl_do(curl);
        pcVar2 = uVar3.message;
        uVar1 = uVar3.code;
      }
      http_cleanup(curl,&hStack_48);
    }
  }
  uVar3._4_4_ = 0;
  uVar3.code = uVar1;
  uVar3.message = pcVar2;
  return uVar3;
}

Assistant:

struct ufile_error
ufile_head(const char* bucket_name, const char *key, struct ufile_file_info *info){
    struct ufile_error error = NO_ERROR;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }

    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    error = set_http_options(&opt, "HEAD", "", bucket_name, key, NULL);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);
    curl_easy_setopt(curl, CURLOPT_HEADERFUNCTION, head_header_cb);
    curl_easy_setopt(curl, CURLOPT_HEADERDATA, (void *)info);
    curl_easy_setopt(curl, CURLOPT_NOBODY, 1);

    error = curl_do(curl);
    http_cleanup(curl, &opt);
    return error;
}